

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-parser.cpp
# Opt level: O2

Result<wasm::Ok> * __thiscall
wasm::WATParser::parseModule
          (Result<wasm::Ok> *__return_storage_ptr__,WATParser *this,Module *wasm,string_view in,
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *filename)

{
  char **this_00;
  string_view buffer;
  undefined1 local_b0 [8];
  Lexer lexer;
  
  this_00 = &lexer.buffer._M_str;
  std::
  _Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ::_Optional_base((_Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                    *)this_00,
                   (_Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                    *)in._M_str);
  buffer._M_str = (char *)in._M_len;
  buffer._M_len = (size_t)wasm;
  Lexer::Lexer((Lexer *)local_b0,buffer,
               (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)this_00);
  std::
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&lexer.buffer._M_str);
  anon_unknown_12::doParseModule(__return_storage_ptr__,(Module *)this,(Lexer *)local_b0,false);
  Lexer::~Lexer((Lexer *)local_b0);
  return __return_storage_ptr__;
}

Assistant:

Result<> parseModule(Module& wasm,
                     std::string_view in,
                     std::optional<std::string> filename) {
  Lexer lexer(in, filename);
  return doParseModule(wasm, lexer, false);
}